

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O1

void __thiscall wasm::InstrumentMemory::visitLoad(InstrumentMemory *this,Load *curr)

{
  Type indexType;
  ulong uVar1;
  uintptr_t uVar2;
  undefined8 uVar3;
  uintptr_t uVar4;
  uint uVar5;
  Memory *pMVar6;
  Const *pCVar7;
  Expression *pEVar8;
  MixedArena *pMVar9;
  initializer_list<wasm::Expression_*> __l;
  initializer_list<wasm::Expression_*> __l_00;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_90;
  Expression *local_78;
  undefined8 local_70;
  uintptr_t local_68;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_60;
  InstrumentMemory *local_48;
  Builder local_40;
  Builder builder;
  
  this->id = this->id + 1;
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
       ).super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.
       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.currModule
  ;
  pMVar6 = Module::getMemory(local_40.wasm,(Name)(curr->memory).super_IString.str);
  indexType.id = (pMVar6->indexType).id;
  pCVar7 = Builder::makeConstPtr(&local_40,(curr->offset).addr,indexType);
  local_70 = _ZN4wasmL8load_ptrE_0;
  local_68 = _ZN4wasmL8load_ptrE_1;
  local_48 = this;
  local_90.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)Builder::makeConst<int>(&local_40,this->id);
  local_90.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)Builder::makeConst<int>(&local_40,(uint)curr->bytes);
  local_78 = curr->ptr;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_90;
  local_90.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_60,__l,(allocator_type *)((long)&builder.wasm + 7));
  pMVar9 = &(local_40.wasm)->allocator;
  pEVar8 = (Expression *)MixedArena::allocSpace(pMVar9,0x48,8);
  pEVar8->_id = CallId;
  (pEVar8->type).id = 0;
  *(undefined8 *)(pEVar8 + 1) = 0;
  pEVar8[1].type.id = 0;
  *(undefined8 *)(pEVar8 + 2) = 0;
  pEVar8[2].type.id = (uintptr_t)pMVar9;
  *(undefined8 *)(pEVar8 + 3) = 0;
  pEVar8[3].type.id = 0;
  *(undefined1 *)&pEVar8[4]._id = InvalidId;
  (pEVar8->type).id = indexType.id;
  *(undefined8 *)(pEVar8 + 3) = local_70;
  pEVar8[3].type.id = local_68;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar8 + 1),
             &local_60);
  *(undefined1 *)&pEVar8[4]._id = InvalidId;
  curr->ptr = pEVar8;
  if (local_60.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id;
  if (uVar1 < 7) {
    uVar5 = (int)uVar1 - 2;
    if (uVar5 < 4) {
      uVar2 = *(uintptr_t *)(&PTR_DAT_00d88fc0)[uVar5];
      uVar3 = *(undefined8 *)(&PTR_load_val_i32_00d88fa0)[uVar5];
      local_60.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)Builder::makeConst<int>(&local_40,local_48->id);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_60;
      local_60.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)curr;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                (&local_90,__l_00,(allocator_type *)((long)&builder.wasm + 7));
      uVar4 = (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id;
      pMVar9 = &(local_40.wasm)->allocator;
      pEVar8 = (Expression *)MixedArena::allocSpace(pMVar9,0x48,8);
      pEVar8->_id = CallId;
      (pEVar8->type).id = 0;
      *(undefined8 *)(pEVar8 + 1) = 0;
      pEVar8[1].type.id = 0;
      *(undefined8 *)(pEVar8 + 2) = 0;
      pEVar8[2].type.id = (uintptr_t)pMVar9;
      *(undefined8 *)(pEVar8 + 3) = 0;
      pEVar8[3].type.id = 0;
      *(undefined1 *)&pEVar8[4]._id = InvalidId;
      (pEVar8->type).id = uVar4;
      *(undefined8 *)(pEVar8 + 3) = uVar3;
      pEVar8[3].type.id = uVar2;
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar8 + 1),
                 &local_90);
      *(undefined1 *)&pEVar8[4]._id = InvalidId;
      Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::replaceCurrent
                (&(local_48->
                  super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
                  ).
                  super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                  .
                  super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                 ,pEVar8);
      if ((Const *)local_90.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start != (Const *)0x0) {
        operator_delete(local_90.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    return;
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                ,0xc6,"BasicType wasm::Type::getBasic() const");
}

Assistant:

void visitLoad(Load* curr) {
    id++;
    Builder builder(*getModule());
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    auto offset = builder.makeConstPtr(curr->offset.addr, indexType);
    curr->ptr = builder.makeCall(load_ptr,
                                 {builder.makeConst(int32_t(id)),
                                  builder.makeConst(int32_t(curr->bytes)),
                                  offset,
                                  curr->ptr},
                                 indexType);
    Name target;
    switch (curr->type.getBasic()) {
      case Type::i32:
        target = load_val_i32;
        break;
      case Type::i64:
        target = load_val_i64;
        break;
      case Type::f32:
        target = load_val_f32;
        break;
      case Type::f64:
        target = load_val_f64;
        break;
      default:
        return; // TODO: other types, unreachable, etc.
    }
    replaceCurrent(builder.makeCall(
      target, {builder.makeConst(int32_t(id)), curr}, curr->type));
  }